

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O2

bool __thiscall
OpenMD::
OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
::operator()(OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  bool bVar1;
  bool bVar2;
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)data);
  bVar1 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
          ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                        *)(this + 0x20),&local_48);
  bVar2 = true;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&sStack_68,(string *)data);
    bVar2 = EqualIgnoreCaseConstraint::operator()
                      ((EqualIgnoreCaseConstraint *)(this + 0x300),&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return bVar2;
}

Assistant:

bool operator()(DataType data) const {
      return cons1_(data) || cons2_(data);
    }